

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger table_map(HSQUIRRELVM v)

{
  SQTable *x;
  SQObjectPtr *this;
  long in_RDI;
  SQObjectPtr ret;
  SQObject *o;
  HSQUIRRELVM in_stack_00000098;
  SQTable *in_stack_000000a0;
  SQTable *in_stack_000000a8;
  SQInteger in_stack_ffffffffffffffb8;
  SQInteger nInitialSize;
  SQSharedState *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  SQVM *in_stack_ffffffffffffffd0;
  SQObjectPtr local_28;
  SQObjectPtr *local_18;
  long local_10;
  SQInteger local_8;
  
  local_10 = in_RDI;
  local_18 = stack_get((HSQUIRRELVM)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  nInitialSize = *(SQInteger *)(local_10 + 0x128);
  SQTable::CountUsed((local_18->super_SQObject)._unVal.pTable);
  x = SQTable::Create(in_stack_ffffffffffffffc0,nInitialSize);
  SQObjectPtr::SQObjectPtr(&local_28,x);
  this = (SQObjectPtr *)__map_table(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
  if ((long)this < 0) {
    local_8 = -1;
  }
  else {
    SQVM::Push(in_stack_ffffffffffffffd0,
               (SQObjectPtr *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    local_8 = 1;
  }
  SQObjectPtr::~SQObjectPtr(this);
  return local_8;
}

Assistant:

static SQInteger table_map(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v, 1);
    SQObjectPtr ret = SQTable::Create(_ss(v), _table(o)->CountUsed());
    if(SQ_FAILED(__map_table(_table(ret), _table(o), v)))
        return SQ_ERROR;
    v->Push(ret);
    return 1;
}